

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O3

RTVector3 __thiscall RTIMUMagCal::removeMagCalData(RTIMUMagCal *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  RTVector3 RVar4;
  RTVector3 ret;
  RTVector3 local_18;
  
  RTVector3::RTVector3(&local_18);
  if (this->m_magCalCount != 0) {
    iVar1 = this->m_magCalOutIndex;
    this->m_magCalOutIndex = iVar1 + 1;
    RTVector3::operator=(&local_18,&this->m_magMax + (long)iVar1 + 2);
    if (this->m_magCalOutIndex == 20000) {
      this->m_magCalOutIndex = 0;
    }
    this->m_magCalCount = this->m_magCalCount + -1;
    uVar3 = (0.0 <= local_18.m_data[0]) + 2;
    if (local_18.m_data[1] < 0.0) {
      uVar3 = (uint)(0.0 <= local_18.m_data[0]);
    }
    uVar2 = uVar3 + 4;
    if (local_18.m_data[2] < 0.0) {
      uVar2 = uVar3;
    }
    this->m_octantCounts[uVar2] = this->m_octantCounts[uVar2] + -1;
  }
  RVar4.m_data[1] = local_18.m_data[1];
  RVar4.m_data[0] = local_18.m_data[0];
  RVar4.m_data[2] = local_18.m_data[2];
  return (RTVector3)RVar4.m_data;
}

Assistant:

RTVector3 RTIMUMagCal::removeMagCalData()
{
    RTVector3 ret;

    if (m_magCalCount == 0)
        return ret;

    ret = m_magCalSamples[m_magCalOutIndex++];
    if (m_magCalOutIndex == RTIMUCALDEFS_MAX_MAG_SAMPLES)
        m_magCalOutIndex = 0;
    m_magCalCount--;
    m_octantCounts[findOctant(ret)]--;
    return ret;
}